

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderTests.cpp
# Opt level: O0

void deqp::egl::anon_unknown_4::draw
               (Functions *gl,EGLint api,Program *program,DrawPrimitiveOp *drawOp)

{
  NotSupportedError *this;
  allocator<char> local_49;
  string local_48;
  DrawPrimitiveOp *local_28;
  DrawPrimitiveOp *drawOp_local;
  Program *program_local;
  Functions *pFStack_10;
  EGLint api_local;
  Functions *gl_local;
  
  local_28 = drawOp;
  drawOp_local = (DrawPrimitiveOp *)program;
  program_local._4_4_ = api;
  pFStack_10 = gl;
  if (api == 4) {
    drawGLES2(gl,program,drawOp);
  }
  else {
    if (api != 0x40) {
      this = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"Unsupported API",&local_49);
      tcu::NotSupportedError::NotSupportedError(this,&local_48);
      __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
      ;
    }
    drawGLES2(gl,program,drawOp);
  }
  return;
}

Assistant:

void draw (const glw::Functions& gl, EGLint api, const Program& program, const DrawPrimitiveOp& drawOp)
{
	switch (api)
	{
		case EGL_OPENGL_ES2_BIT:		drawGLES2(gl, program, drawOp);		break;
		case EGL_OPENGL_ES3_BIT_KHR:	drawGLES2(gl, program, drawOp);		break;
		default:
			throw tcu::NotSupportedError("Unsupported API");
	}
}